

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

PaddingLayerParams_PaddingConstant * __thiscall
CoreML::Specification::PaddingLayerParams_PaddingConstant::New
          (PaddingLayerParams_PaddingConstant *this,Arena *arena)

{
  PaddingLayerParams_PaddingConstant *this_00;
  PaddingLayerParams_PaddingConstant *n;
  Arena *arena_local;
  PaddingLayerParams_PaddingConstant *this_local;
  
  this_00 = (PaddingLayerParams_PaddingConstant *)operator_new(0x18);
  PaddingLayerParams_PaddingConstant(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::PaddingLayerParams_PaddingConstant>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

PaddingLayerParams_PaddingConstant* PaddingLayerParams_PaddingConstant::New(::google::protobuf::Arena* arena) const {
  PaddingLayerParams_PaddingConstant* n = new PaddingLayerParams_PaddingConstant;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}